

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_wString __thiscall ON_SubD_ComponentIdTypeAndTag::ToString(ON_SubD_ComponentIdTypeAndTag *this)

{
  uint uVar1;
  ON_SubDVertexTag vertex_tag;
  ON_SubDEdgeTag edge_tag;
  byte bVar2;
  ON_SubD_ComponentIdTypeAndTag *in_RSI;
  ON_SubD local_48;
  ON_SubD_ComponentIdTypeAndTag *this_local;
  
  this_local = this;
  switch(in_RSI->m_type) {
  case Unset:
    goto LAB_0086b61d;
  default:
LAB_0086b61d:
    ON_wString::ON_wString((ON_wString *)this,L"Unset");
    break;
  case Vertex:
    ON_wString::FormatToString
              ((wchar_t *)&stack0xffffffffffffffe0,L"Vertex id=%u tag=",(ulong)in_RSI->m_id);
    vertex_tag = VertexTag(in_RSI);
    ON_SubD::VertexTagToString((ON_SubD *)&stack0xffffffffffffffd8,vertex_tag,false);
    ON_wString::operator+((ON_wString *)this,(ON_wString *)&stack0xffffffffffffffe0);
    ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffd8);
    ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffe0);
    break;
  case Edge:
    ON_wString::FormatToString
              ((wchar_t *)&local_48.super_ON_Geometry.super_ON_Object.m_userdata_list,
               L"Edge id=%u tag=",(ulong)in_RSI->m_id);
    edge_tag = EdgeTag(in_RSI);
    ON_SubD::EdgeTagToString(&local_48,edge_tag,false);
    ON_wString::operator+
              ((ON_wString *)this,
               (ON_wString *)&local_48.super_ON_Geometry.super_ON_Object.m_userdata_list);
    ON_wString::~ON_wString((ON_wString *)&local_48);
    ON_wString::~ON_wString
              ((ON_wString *)&local_48.super_ON_Geometry.super_ON_Object.m_userdata_list);
    break;
  case Face:
    uVar1 = in_RSI->m_id;
    bVar2 = FaceTag(in_RSI);
    ON_wString::FormatToString((wchar_t *)this,L"Face id=%u tag=%u",(ulong)uVar1,(ulong)bVar2);
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_SubD_ComponentIdTypeAndTag::ToString() const
{
  switch (m_type)
  {
  case ON_SubDComponentPtr::Type::Unset:
    break;
  case ON_SubDComponentPtr::Type::Vertex:
    return ON_wString::FormatToString(L"Vertex id=%u tag=",m_id) + ON_SubD::VertexTagToString(VertexTag(),false);
    break;
  case ON_SubDComponentPtr::Type::Edge:
    return ON_wString::FormatToString(L"Edge id=%u tag=",m_id) + ON_SubD::EdgeTagToString(EdgeTag(), false);
    break;
  case ON_SubDComponentPtr::Type::Face:
    return ON_wString::FormatToString(L"Face id=%u tag=%u", m_id, (unsigned)FaceTag());
    break;
  default:
    break;
  }
  return ON_wString(L"Unset");
}